

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

void CVmObjList::set_index_list(vm_val_t *result,char *lst,vm_val_t *index_val,vm_val_t *new_val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  uint uVar4;
  vm_obj_id_t vVar5;
  
  uVar4 = vm_val_t::num_to_int(index_val);
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&new_val->field_0x4;
  aVar1 = new_val->val;
  sp_ = sp_ + 1;
  pvVar3->typ = new_val->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  if ((uVar4 != 0) && (uVar4 <= *(ushort *)lst)) {
    vVar5 = create(0,lst);
    result->typ = VM_OBJ;
    (result->val).obj = vVar5;
    cons_set_element((CVmObjList *)(G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff)),
                     (ulong)(uVar4 - 1),new_val);
    sp_ = sp_ + -1;
    return;
  }
  err_throw(0x7df);
}

Assistant:

void CVmObjList::set_index_list(VMG_ vm_val_t *result, const char *lst,
                                const vm_val_t *index_val,
                                const vm_val_t *new_val)
{
    /* get the index value as an integer */
    uint32_t idx = index_val->num_to_int(vmg0_);

    /* push the new value for gc protection during the create */
    G_stk->push(new_val);

    /* make sure it's in range - 1 to our element count, inclusive */
    if (idx < 1 || idx > vmb_get_len(lst))
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* create a new list as a copy of this list */
    result->set_obj(create(vmg_ FALSE, lst));

    /* get the new list object */
    CVmObjList *obj = (CVmObjList *)vm_objp(vmg_ result->val.obj);

    /* update the element of the new list */
    obj->cons_set_element(idx - 1, new_val);

    /* discard our gc protection */
    G_stk->discard();
}